

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Rendering.cpp
# Opt level: O3

void __thiscall Assimp::X3DImporter::ParseNode_Rendering_TriangleStripSet(X3DImporter *this)

{
  size_t *psVar1;
  long lVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  FIReader *pFVar4;
  char *pcVar5;
  CX3DImporter_NodeElement *pCVar6;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  _List_node_base *p_Var11;
  CX3DImporter_NodeElement *pNode;
  int *piVar12;
  runtime_error *prVar13;
  string *psVar14;
  long lVar15;
  iterator iVar16;
  byte bVar17;
  char *__end;
  long lVar18;
  long lVar19;
  byte bVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  string an;
  string use;
  CX3DImporter_NodeElement *ne;
  vector<int,_std::allocator<int>_> stripCount;
  string def;
  bool local_d9;
  string local_d0;
  vector<int,_std::allocator<int>_> *local_b0;
  string local_a8;
  allocator local_81;
  long local_80;
  int *local_78;
  CX3DImporter_NodeElement *local_70;
  vector<int,_std::allocator<int>_> local_68;
  string local_50;
  undefined4 extraout_var_00;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_70 = (CX3DImporter_NodeElement *)0x0;
  uVar9 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar9 < 1) {
    bVar17 = 1;
    bVar20 = 1;
    local_b0 = (vector<int,_std::allocator<int>_> *)CONCAT71(local_b0._1_7_,1);
    local_d9 = true;
  }
  else {
    uVar23 = 0;
    local_d9 = true;
    local_b0._0_1_ = 1;
    local_78 = (int *)CONCAT71(local_78._1_7_,1);
    local_80 = CONCAT71(local_80._1_7_,1);
    do {
      pFVar4 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      iVar21 = (int)uVar23;
      iVar10 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                         (pFVar4,uVar23);
      std::__cxx11::string::string
                ((string *)&local_d0,(char *)CONCAT44(extraout_var,iVar10),&local_81);
      iVar10 = std::__cxx11::string::compare((char *)&local_d0);
      if (iVar10 == 0) {
        iVar10 = (*(((this->mReader)._M_t.
                     super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                     .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                   super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar10);
        psVar14 = &local_50;
LAB_00691efc:
        pcVar5 = (char *)psVar14->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar14,0,pcVar5,(ulong)__s);
      }
      else {
        iVar10 = std::__cxx11::string::compare((char *)&local_d0);
        if (iVar10 == 0) {
          iVar10 = (*(((this->mReader)._M_t.
                       super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                       .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                     super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar10);
          psVar14 = &local_a8;
          goto LAB_00691efc;
        }
        iVar10 = std::__cxx11::string::compare((char *)&local_d0);
        if (((iVar10 != 0) &&
            (iVar10 = std::__cxx11::string::compare((char *)&local_d0), iVar10 != 0)) &&
           (iVar10 = std::__cxx11::string::compare((char *)&local_d0), iVar10 != 0)) {
          iVar10 = std::__cxx11::string::compare((char *)&local_d0);
          if (iVar10 == 0) {
            local_d9 = XML_ReadNode_GetAttrVal_AsBool(this,iVar21);
          }
          else {
            iVar10 = std::__cxx11::string::compare((char *)&local_d0);
            if (iVar10 == 0) {
              local_b0._0_1_ = XML_ReadNode_GetAttrVal_AsBool(this,iVar21);
            }
            else {
              iVar10 = std::__cxx11::string::compare((char *)&local_d0);
              if (iVar10 == 0) {
                XML_ReadNode_GetAttrVal_AsArrI32(this,iVar21,&local_68);
              }
              else {
                iVar10 = std::__cxx11::string::compare((char *)&local_d0);
                if (iVar10 == 0) {
                  bVar8 = XML_ReadNode_GetAttrVal_AsBool(this,iVar21);
                  local_80 = CONCAT71(local_80._1_7_,bVar8);
                }
                else {
                  iVar10 = std::__cxx11::string::compare((char *)&local_d0);
                  if (iVar10 == 0) {
                    bVar8 = XML_ReadNode_GetAttrVal_AsBool(this,iVar21);
                    local_78 = (int *)CONCAT71(local_78._1_7_,bVar8);
                  }
                  else {
                    Throw_IncorrectAttr(this,&local_d0);
                  }
                }
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      uVar23 = (ulong)(iVar21 + 1U);
    } while (uVar9 != iVar21 + 1U);
    local_b0 = (vector<int,_std::allocator<int>_> *)
               (CONCAT71(local_b0._1_7_,(char)local_b0) & 0xffffffffffffff01);
    bVar17 = (byte)local_80 & 1;
    bVar20 = (byte)local_78 & 1;
  }
  if (local_a8._M_string_length == 0) {
    if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,
                 "TriangleStripSet must contain not empty \"stripCount\" attribute.","");
      std::runtime_error::runtime_error(prVar13,(string *)&local_d0);
      *(undefined ***)prVar13 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(prVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pNode = (CX3DImporter_NodeElement *)operator_new(0xd8);
    pCVar6 = this->NodeElement_Cur;
    pNode->Type = ENET_TriangleStripSet;
    (pNode->ID)._M_dataplus._M_p = (pointer)&(pNode->ID).field_2;
    (pNode->ID)._M_string_length = 0;
    (pNode->ID).field_2._M_local_buf[0] = '\0';
    pNode->Parent = pCVar6;
    (pNode->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&pNode->Child;
    (pNode->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&pNode->Child;
    (pNode->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    *(CX3DImporter_NodeElement **)&pNode[1].Type = pNode + 1;
    pNode[1]._vptr_CX3DImporter_NodeElement = (_func_int **)(pNode + 1);
    pNode[1].ID._M_dataplus._M_p = (pointer)0x0;
    pNode[1].ID._M_string_length = 0;
    pNode[1].ID.field_2._M_local_buf[0] = '\x01';
    pNode->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_Set_008ca9c0;
    *(undefined8 *)((long)&pNode[1].ID.field_2 + 8) = 0;
    pNode[1].Parent = (CX3DImporter_NodeElement *)0x0;
    pNode[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    pNode[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    pNode[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    pNode[2]._vptr_CX3DImporter_NodeElement = (_func_int **)0x0;
    *(undefined8 *)&pNode[2].Type = 0;
    pNode[2].ID._M_dataplus._M_p = (pointer)0x0;
    pNode[2].ID._M_string_length = 0;
    pNode[2].ID.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pNode[2].ID.field_2 + 8) = 0;
    pNode[2].Parent = (CX3DImporter_NodeElement *)0x0;
    local_70 = pNode;
    if (local_50._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&pNode->ID);
    }
    pNode[1].ID.field_2._M_local_buf[1] = local_d9;
    pNode[1].ID.field_2._M_local_buf[2] = (char)local_b0;
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)&pNode[2].ID.field_2,&local_68);
    pNode[1].ID.field_2._M_local_buf[3] = bVar17;
    pNode[1].ID.field_2._M_local_buf[0] = bVar20;
    pCVar6 = *(CX3DImporter_NodeElement **)((long)&pNode[1].ID.field_2 + 8);
    if (pNode[1].Parent != pCVar6) {
      pNode[1].Parent = pCVar6;
    }
    piVar12 = (int *)pNode[2].ID.field_2._M_allocated_capacity;
    if (piVar12 != *(int **)((long)&pNode[2].ID.field_2 + 8)) {
      local_b0 = (vector<int,_std::allocator<int>_> *)
                 (&pNode[1].ID.field_2._M_allocated_capacity + 1);
      local_80 = 0;
      do {
        if (*piVar12 < 3) {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,
                     "TriangleStripSet. stripCount shall be greater than or equal to three.","");
          std::runtime_error::runtime_error(prVar13,(string *)&local_d0);
          *(undefined ***)prVar13 = &PTR__runtime_error_007fc4b8;
          __cxa_throw(prVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar18 = local_80 + 1;
        bVar8 = true;
        lVar15 = 2;
        lVar19 = local_80;
        local_78 = piVar12;
        do {
          lVar2 = local_80 + lVar15;
          iVar21 = (int)lVar19;
          iVar10 = (int)lVar18;
          iVar22 = (int)lVar2;
          local_d0._M_dataplus._M_p._0_4_ = iVar21;
          if (local_d9 == false) {
            iVar16._M_current = (int *)pNode[1].Parent;
            if ((_List_node_base *)iVar16._M_current ==
                pNode[1].Child.
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node.super__List_node_base._M_next) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (local_b0,iVar16,(int *)&local_d0);
              iVar16._M_current = (int *)pNode[1].Parent;
            }
            else {
              *iVar16._M_current = iVar21;
              iVar16._M_current =
                   (int *)((long)&(pNode[1].Parent)->_vptr_CX3DImporter_NodeElement + 4);
              pNode[1].Parent = (CX3DImporter_NodeElement *)iVar16._M_current;
            }
            if ((_List_node_base *)iVar16._M_current ==
                pNode[1].Child.
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node.super__List_node_base._M_next) {
              local_d0._M_dataplus._M_p._0_4_ = iVar22;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (local_b0,iVar16,(int *)&local_d0);
              iVar16._M_current = (int *)pNode[1].Parent;
            }
            else {
              *iVar16._M_current = iVar22;
              iVar16._M_current =
                   (int *)((long)&(pNode[1].Parent)->_vptr_CX3DImporter_NodeElement + 4);
              pNode[1].Parent = (CX3DImporter_NodeElement *)iVar16._M_current;
            }
            local_d0._M_dataplus._M_p._0_4_ = iVar10;
            if ((_List_node_base *)iVar16._M_current !=
                pNode[1].Child.
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node.super__List_node_base._M_next) {
              *iVar16._M_current = iVar10;
              goto LAB_006922c6;
            }
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (local_b0,iVar16,(int *)&local_d0);
          }
          else {
            iVar16._M_current = (int *)pNode[1].Parent;
            if ((_List_node_base *)iVar16._M_current ==
                pNode[1].Child.
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node.super__List_node_base._M_next) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (local_b0,iVar16,(int *)&local_d0);
              iVar16._M_current = (int *)pNode[1].Parent;
            }
            else {
              *iVar16._M_current = iVar21;
              iVar16._M_current =
                   (int *)((long)&(pNode[1].Parent)->_vptr_CX3DImporter_NodeElement + 4);
              pNode[1].Parent = (CX3DImporter_NodeElement *)iVar16._M_current;
            }
            if ((_List_node_base *)iVar16._M_current ==
                pNode[1].Child.
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node.super__List_node_base._M_next) {
              local_d0._M_dataplus._M_p._0_4_ = iVar10;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (local_b0,iVar16,(int *)&local_d0);
              iVar16._M_current = (int *)pNode[1].Parent;
            }
            else {
              *iVar16._M_current = iVar10;
              iVar16._M_current =
                   (int *)((long)&(pNode[1].Parent)->_vptr_CX3DImporter_NodeElement + 4);
              pNode[1].Parent = (CX3DImporter_NodeElement *)iVar16._M_current;
            }
            local_d0._M_dataplus._M_p._0_4_ = iVar22;
            if ((_List_node_base *)iVar16._M_current ==
                pNode[1].Child.
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node.super__List_node_base._M_next) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (local_b0,iVar16,(int *)&local_d0);
            }
            else {
              *iVar16._M_current = iVar22;
LAB_006922c6:
              pNode[1].Parent =
                   (CX3DImporter_NodeElement *)
                   ((long)&(pNode[1].Parent)->_vptr_CX3DImporter_NodeElement + 4);
            }
          }
          local_d0._M_dataplus._M_p._0_4_ = 0xffffffff;
          iVar16._M_current = (int *)pNode[1].Parent;
          if ((_List_node_base *)iVar16._M_current ==
              pNode[1].Child.
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node.super__List_node_base._M_next) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (local_b0,iVar16,(int *)&local_d0);
          }
          else {
            *iVar16._M_current = -1;
            pNode[1].Parent =
                 (CX3DImporter_NodeElement *)
                 ((long)&(pNode[1].Parent)->_vptr_CX3DImporter_NodeElement + 4);
          }
          if (!bVar8) {
            lVar18 = lVar2;
            lVar2 = lVar19;
          }
          lVar19 = lVar2;
          bVar8 = (bool)(bVar8 ^ 1);
          lVar15 = lVar15 + 1;
        } while ((int)lVar15 < *local_78);
        piVar12 = local_78 + 1;
        local_80 = local_80 + lVar15;
      } while (piVar12 != *(int **)((long)&pNode[2].ID.field_2 + 8));
    }
    iVar10 = (*(((this->mReader)._M_t.
                 super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                 super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
               super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((char)iVar10 == '\0') {
      ParseHelper_Node_Enter(this,pNode);
      paVar3 = &local_d0.field_2;
      do {
        do {
          while( true ) {
            iVar10 = (*(((this->mReader)._M_t.
                         super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                         .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                       super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])();
            if ((char)iVar10 == '\0') {
              local_d0._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d0,"TriangleStripSet","");
              Throw_CloseNotFound(this,&local_d0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != paVar3) {
                operator_delete(local_d0._M_dataplus._M_p);
              }
              goto LAB_006926d2;
            }
            iVar10 = (*(((this->mReader)._M_t.
                         super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                         .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                       super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
            if (iVar10 != 1) break;
            local_d0._M_dataplus._M_p = (pointer)paVar3;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Color","");
            (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
            iVar10 = std::__cxx11::string::compare((char *)&local_d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != paVar3) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            if (iVar10 == 0) {
              ParseNode_Rendering_Color(this);
            }
            else {
              local_d0._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"ColorRGBA","");
              (*(((this->mReader)._M_t.
                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
              iVar10 = std::__cxx11::string::compare((char *)&local_d0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != paVar3) {
                operator_delete(local_d0._M_dataplus._M_p);
              }
              if (iVar10 == 0) {
                ParseNode_Rendering_ColorRGBA(this);
              }
              else {
                local_d0._M_dataplus._M_p = (pointer)paVar3;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Coordinate","")
                ;
                (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                iVar10 = std::__cxx11::string::compare((char *)&local_d0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d0._M_dataplus._M_p != paVar3) {
                  operator_delete(local_d0._M_dataplus._M_p);
                }
                if (iVar10 == 0) {
                  ParseNode_Rendering_Coordinate(this);
                }
                else {
                  local_d0._M_dataplus._M_p = (pointer)paVar3;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Normal","");
                  (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                  iVar10 = std::__cxx11::string::compare((char *)&local_d0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_d0._M_dataplus._M_p != paVar3) {
                    operator_delete(local_d0._M_dataplus._M_p);
                  }
                  if (iVar10 == 0) {
                    ParseNode_Rendering_Normal(this);
                  }
                  else {
                    local_d0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_d0,"TextureCoordinate","");
                    (*(((this->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                    iVar10 = std::__cxx11::string::compare((char *)&local_d0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d0._M_dataplus._M_p != paVar3) {
                      operator_delete(local_d0._M_dataplus._M_p);
                    }
                    if (iVar10 == 0) {
                      ParseNode_Texturing_TextureCoordinate(this);
                    }
                    else {
                      bVar8 = ParseHelper_CheckRead_X3DMetadataObject(this);
                      if (!bVar8) {
                        local_d0._M_dataplus._M_p = (pointer)paVar3;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_d0,"TriangleStripSet","");
                        XML_CheckNode_SkipUnsupported(this,&local_d0);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_d0._M_dataplus._M_p != paVar3) {
                          operator_delete(local_d0._M_dataplus._M_p);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          iVar10 = (*(((this->mReader)._M_t.
                       super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                       .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                     super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
        } while (iVar10 != 2);
        local_d0._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"TriangleStripSet","");
        (*(((this->mReader)._M_t.
            super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
            super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
            super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
          super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
        iVar10 = std::__cxx11::string::compare((char *)&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar3) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
      } while (iVar10 != 0);
LAB_006926d2:
      ParseHelper_Node_Exit(this);
    }
    else {
      pCVar6 = this->NodeElement_Cur;
      p_Var11 = (_List_node_base *)operator_new(0x18);
      p_Var11[1]._M_next = (_List_node_base *)pNode;
      std::__detail::_List_node_base::_M_hook(p_Var11);
      psVar1 = &(pCVar6->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var11 = (_List_node_base *)operator_new(0x18);
    p_Var11[1]._M_next = (_List_node_base *)pNode;
    std::__detail::_List_node_base::_M_hook(p_Var11);
    plVar7 = &this->NodeElement_List;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_50._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar8 = FindNodeElement(this,&local_a8,ENET_TriangleStripSet,&local_70);
    if (!bVar8) {
      Throw_USE_NotFound(this,&local_a8);
    }
    pCVar6 = this->NodeElement_Cur;
    p_Var11 = (_List_node_base *)operator_new(0x18);
    p_Var11[1]._M_next = (_List_node_base *)local_70;
    std::__detail::_List_node_base::_M_hook(p_Var11);
    plVar7 = &pCVar6->Child;
  }
  psVar1 = &(plVar7->
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Rendering_TriangleStripSet()
{
    std::string use, def;
    bool ccw = true;
    bool colorPerVertex = true;
    std::vector<int32_t> stripCount;
    bool normalPerVertex = true;
    bool solid = true;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("ccw", ccw, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("colorPerVertex", colorPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_REF("stripCount", stripCount, XML_ReadNode_GetAttrVal_AsArrI32);
		MACRO_ATTRREAD_CHECK_RET("normalPerVertex", normalPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_TriangleStripSet, ne);
	}
	else
	{
		// check data
		if(stripCount.size() == 0) throw DeadlyImportError("TriangleStripSet must contain not empty \"stripCount\" attribute.");

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Set(CX3DImporter_NodeElement::ENET_TriangleStripSet, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		CX3DImporter_NodeElement_Set& ne_alias = *((CX3DImporter_NodeElement_Set*)ne);

		ne_alias.CCW = ccw;
		ne_alias.ColorPerVertex = colorPerVertex;
		ne_alias.VertexCount = stripCount;
		ne_alias.NormalPerVertex = normalPerVertex;
		ne_alias.Solid = solid;
		// create CoordIdx
		size_t coord_num0, coord_num1, coord_num2;// indices of current triangle
		bool odd_tri;// sequence of current triangle
		size_t coord_num_sb;// index of first point of strip

		ne_alias.CoordIndex.clear();
		coord_num_sb = 0;
		for(std::vector<int32_t>::const_iterator vc_it = ne_alias.VertexCount.begin(); vc_it != ne_alias.VertexCount.end(); ++vc_it)
		{
			if(*vc_it < 3) throw DeadlyImportError("TriangleStripSet. stripCount shall be greater than or equal to three.");

			// set initial values for first triangle
			coord_num0 = coord_num_sb;
			coord_num1 = coord_num_sb + 1;
			coord_num2 = coord_num_sb + 2;
			odd_tri = true;

			for(int32_t vc = 2; vc < *vc_it; vc++)
			{
				if(ccw)
				{
					// 0 2
					//  1
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num0));
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num1));
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num2));
				}
				else
				{
					// 0 1
					//  2
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num0));
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num2));
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num1));
				}// if(ccw) else

				ne_alias.CoordIndex.push_back(-1);// add face delimiter.
				// prepare values for next triangle
				if(odd_tri)
				{
					coord_num0 = coord_num2;
					coord_num2++;
				}
				else
				{
					coord_num1 = coord_num2;
					coord_num2 = coord_num1 + 1;
				}

				odd_tri = !odd_tri;
				coord_num_sb = coord_num2;// that index will be start of next strip
			}// for(int32_t vc = 2; vc < *vc_it; vc++)
		}// for(std::list<int32_t>::const_iterator vc_it = ne_alias.VertexCount.begin(); vc_it != ne_alias.VertexCount.end(); vc_it++)
        // check for child nodes
        if(!mReader->isEmptyElement())
        {
			ParseHelper_Node_Enter(ne);
			MACRO_NODECHECK_LOOPBEGIN("TriangleStripSet");
				// check for X3DComposedGeometryNodes
				if(XML_CheckNode_NameEqual("Color")) { ParseNode_Rendering_Color(); continue; }
				if(XML_CheckNode_NameEqual("ColorRGBA")) { ParseNode_Rendering_ColorRGBA(); continue; }
				if(XML_CheckNode_NameEqual("Coordinate")) { ParseNode_Rendering_Coordinate(); continue; }
				if(XML_CheckNode_NameEqual("Normal")) { ParseNode_Rendering_Normal(); continue; }
				if(XML_CheckNode_NameEqual("TextureCoordinate")) { ParseNode_Texturing_TextureCoordinate(); continue; }
				// check for X3DMetadataObject
				if(!ParseHelper_CheckRead_X3DMetadataObject()) XML_CheckNode_SkipUnsupported("TriangleStripSet");

			MACRO_NODECHECK_LOOPEND("TriangleStripSet");
			ParseHelper_Node_Exit();
		}// if(!mReader->isEmptyElement())
		else
		{
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element
		}

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}